

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O2

bool do_write_jpeg_image(jpeg_compress_struct *cinfo,JSAMPROW *row_pointer,QImage *image,
                        QIODevice *device,int sourceQuality,QString *description,bool optimize,
                        bool progressive,bool invertCMYK)

{
  long lVar1;
  jpeg_component_info *pjVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  UINT16 UVar5;
  int i;
  int iVar6;
  JDIMENSION JVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  jpeg_destination_mgr *pjVar12;
  jpeg_error_mgr *pjVar13;
  _Rb_tree_node_base *p_Var14;
  JSAMPROW pJVar15;
  void *pvVar16;
  long lVar17;
  J_COLOR_SPACE JVar18;
  Data *pDVar19;
  char *pcVar20;
  size_t __n;
  uint uVar21;
  P _a;
  long lVar22;
  _Rb_tree_node_base *p_Var23;
  size_t __n_00;
  long in_FS_OFFSET;
  bool bVar24;
  bool bVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  QArrayDataPointer<unsigned_int> local_318;
  QArrayDataPointer<char> local_2f8;
  QArrayDataPointer<char> local_2e0;
  QArrayDataPointer<char> local_2c8;
  QMap<QString,_QString> text;
  QArrayDataPointer<char> local_2a8;
  QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray> local_290;
  QStringBuilder<QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>,_QByteArray>
  local_258;
  QArrayDataPointer<char> local_208;
  QArrayDataPointer<char> local_1e8;
  QArrayDataPointer<char> local_1c8;
  my_error_mgr jerr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_318.size = -0x5555555555555556;
  local_318.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_318.ptr = (uint *)0xaaaaaaaaaaaaaaaa;
  QImage::colorTable();
  iVar6 = QImage::format();
  if ((iVar6 == 0) || (iVar6 = QImage::format(), iVar6 == 0x17)) {
    bVar25 = false;
  }
  else {
    pjVar12 = (jpeg_destination_mgr *)operator_new(0x1030);
    pjVar12->init_destination = qt_init_destination;
    pjVar12->empty_output_buffer = qt_empty_output_buffer;
    pjVar12->term_destination = qt_term_destination;
    pjVar12[1].next_output_byte = (JOCTET *)device;
    pjVar12->next_output_byte = (JOCTET *)&pjVar12[1].free_in_buffer;
    pjVar12->free_in_buffer = 0x1000;
    memset(&jerr,0xaa,0x170);
    pjVar13 = (jpeg_error_mgr *)jpeg_std_error(&jerr);
    cinfo->err = pjVar13;
    jerr.super_jpeg_error_mgr.error_exit = my_error_exit;
    jerr.super_jpeg_error_mgr.output_message = my_output_message;
    iVar6 = _setjmp((__jmp_buf_tag *)jerr.setjmp_buffer);
    bVar25 = iVar6 == 0;
    if (bVar25) {
      jpeg_CreateCompress(cinfo,0x50,0x248);
      cinfo->dest = pjVar12;
      JVar7 = QImage::width();
      cinfo->image_width = JVar7;
      JVar7 = QImage::height();
      cinfo->image_height = JVar7;
      iVar6 = QImage::format();
      if (iVar6 - 1U < 3) {
        iVar6 = QImage::colorCount();
        lVar22 = (long)iVar6;
        uVar11 = 1;
        while( true ) {
          bVar24 = lVar22 == 0;
          lVar22 = lVar22 + -1;
          bVar4 = (byte)uVar11;
          if ((bVar4 == 0) || (bVar24)) break;
          bVar24 = qIsGray(local_318.ptr[lVar22]);
          uVar11 = (uint)bVar24;
        }
        cinfo->input_components = ((byte)~bVar4 & 1) * 2 + 1;
        JVar18 = JCS_RGB - uVar11;
      }
      else if ((iVar6 == 0x18) || (iVar6 == 0x1c)) {
        cinfo->input_components = 1;
        bVar4 = 1;
        JVar18 = JCS_GRAYSCALE;
      }
      else {
        if (iVar6 == 0x24) {
          cinfo->input_components = 4;
          JVar18 = JCS_CMYK;
        }
        else {
          JVar18 = JCS_RGB;
          cinfo->input_components = 3;
        }
        bVar4 = 0;
      }
      cinfo->in_color_space = JVar18;
      jpeg_set_defaults(cinfo);
      iVar6 = QImage::dotsPerMeterX();
      iVar8 = QImage::dotsPerMeterX();
      iVar9 = QImage::dotsPerMeterY();
      iVar10 = QImage::dotsPerMeterY();
      auVar32._0_8_ = (double)iVar6 * 2.54;
      auVar32._8_8_ = (double)iVar9 * 2.54;
      auVar32 = divpd(auVar32,_DAT_0010a0c0);
      auVar36._0_8_ = (double)iVar8 * 2.54;
      auVar36._8_8_ = (double)iVar10 * 2.54;
      auVar37 = divpd(auVar36,_DAT_0010a0c0);
      dVar30 = auVar32._0_8_ -
               (double)(int)((double)((ulong)auVar37._0_8_ & 0x8000000000000000 | 0x3fe0000000000000
                                     ) + auVar37._0_8_);
      dVar33 = auVar32._8_8_ -
               (double)(int)((double)((ulong)auVar37._8_8_ & 0x8000000000000000 | 0x3fe0000000000000
                                     ) + auVar37._8_8_);
      uVar26 = -(ulong)(dVar30 < -dVar30);
      uVar28 = -(ulong)(dVar33 < -dVar33);
      iVar6 = QImage::dotsPerMeterX();
      iVar8 = QImage::dotsPerMeterX();
      iVar9 = QImage::dotsPerMeterY();
      iVar10 = QImage::dotsPerMeterY();
      auVar37._0_8_ = (double)iVar6;
      auVar37._8_8_ = (double)iVar9;
      auVar35._0_8_ = (double)iVar8;
      auVar35._8_8_ = (double)iVar10;
      auVar35 = divpd(auVar35,_DAT_0010a0c0);
      auVar32 = divpd(auVar37,_DAT_0010a0c0);
      dVar31 = auVar32._0_8_ -
               (double)(int)((double)((ulong)auVar35._0_8_ & 0x8000000000000000 | 0x3fe0000000000000
                                     ) + auVar35._0_8_);
      dVar34 = auVar32._8_8_ -
               (double)(int)((double)((ulong)auVar35._8_8_ & 0x8000000000000000 | 0x3fe0000000000000
                                     ) + auVar35._8_8_);
      uVar27 = -(ulong)(dVar31 < -dVar31);
      uVar29 = -(ulong)(dVar34 < -dVar34);
      if (((double)(~uVar29 & (ulong)dVar34 | (ulong)-dVar34 & uVar29) +
          (double)(~uVar27 & (ulong)dVar31 | (ulong)-dVar31 & uVar27)) * 2.54 <=
          (double)(~uVar28 & (ulong)dVar33 | (ulong)-dVar33 & uVar28) +
          (double)(~uVar26 & (ulong)dVar30 | (ulong)-dVar30 & uVar26)) {
        cinfo->density_unit = '\x02';
        iVar6 = QImage::dotsPerMeterX();
        cinfo->X_density = (UINT16)((iVar6 + 0x32) / 100);
        iVar6 = QImage::dotsPerMeterY();
        UVar5 = (UINT16)((iVar6 + 0x32) / 100);
      }
      else {
        cinfo->density_unit = '\x01';
        iVar6 = QImage::dotsPerMeterX();
        dVar30 = ((double)iVar6 * 2.54) / 100.0;
        cinfo->X_density =
             (UINT16)(int)((double)((ulong)dVar30 & 0x8000000000000000 | (ulong)DAT_0010a0e0) +
                          dVar30);
        iVar6 = QImage::dotsPerMeterY();
        dVar30 = ((double)iVar6 * 2.54) / 100.0;
        UVar5 = (UINT16)(int)((double)((ulong)dVar30 & 0x8000000000000000 | (ulong)DAT_0010a0e0) +
                             dVar30);
      }
      cinfo->Y_density = UVar5;
      if (optimize) {
        cinfo->optimize_coding = 1;
      }
      if (progressive) {
        jpeg_simple_progression(cinfo);
      }
      uVar11 = 100;
      if ((uint)sourceQuality < 100) {
        uVar11 = sourceQuality;
      }
      uVar21 = 0x4b;
      if (-1 < sourceQuality) {
        uVar21 = uVar11;
      }
      jpeg_set_quality(cinfo,uVar21,1);
      if (0x5a < uVar21) {
        pjVar2 = cinfo->comp_info;
        pjVar2->h_samp_factor = 1;
        pjVar2->v_samp_factor = 1;
      }
      jpeg_start_compress(cinfo,1);
      text.d.d.ptr = (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
                      )(totally_ordered_wrapper<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_*>
                        )0xaaaaaaaaaaaaaaaa;
      qt_getImageText((QImage *)&text,(QString *)image);
      if (text.d.d.ptr ==
          (totally_ordered_wrapper<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_*>
           )0x0) {
        p_Var14 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var14 = *(_Rb_tree_node_base **)((long)text.d.d.ptr + 0x20);
      }
      p_Var23 = (_Rb_tree_node_base *)((long)text.d.d.ptr + 0x10);
      if (text.d.d.ptr ==
          (totally_ordered_wrapper<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_*>
           )0x0) {
        p_Var23 = (_Rb_tree_node_base *)0x0;
      }
      for (; p_Var14 != p_Var23; p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
        local_258.a.a.b.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        local_258.a.a.a = (QByteArray *)0xaaaaaaaaaaaaaaaa;
        local_258.a.a.b.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        QString::toUtf8_helper((QString *)&local_258);
        if (local_258.a.a.b.d.ptr != (char *)0x0) {
          QByteArray::append((QByteArray *)&local_258,": ");
        }
        QString::toUtf8_helper((QString *)&local_290);
        QByteArray::append((QByteArray *)&local_258);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_290);
        if ((char *)0xfffd < local_258.a.a.b.d.ptr) {
          QByteArray::truncate((longlong)&local_258);
        }
        pDVar19 = local_258.a.a.b.d.d;
        if (local_258.a.a.b.d.d == (Data *)0x0) {
          pDVar19 = (Data *)&QByteArray::_empty;
        }
        jpeg_write_marker(cinfo,0xfe,pDVar19,(ulong)local_258.a.a.b.d.ptr & 0xffffffff);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_258);
      }
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&text.d);
      if ((cinfo->in_color_space == JCS_CMYK) || (cinfo->in_color_space == JCS_RGB)) {
        local_1c8.size = -0x5555555555555556;
        local_1c8.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_1c8.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        QImage::colorSpace();
        QColorSpace::iccProfile();
        QColorSpace::~QColorSpace((QColorSpace *)&local_258);
        if (local_1c8.size != 0) {
          local_1e8.size = -0x5555555555555556;
          local_1e8.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_1e8.ptr = (char *)0xaaaaaaaaaaaaaaaa;
          QByteArray::QByteArray((QByteArray *)&local_1e8,"ICC_PROFILE",0xc);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_1c8.size + 0xffee;
          iVar8 = SUB164(auVar3 / ZEXT816(0xffef),0);
          iVar9 = 0;
          iVar10 = 0;
          iVar6 = 0;
          if (0 < iVar8) {
            iVar6 = iVar8;
          }
          while (iVar6 != iVar9) {
            lVar22 = local_1c8.size - iVar10;
            if (0xffee < lVar22) {
              lVar22 = 0xffef;
            }
            local_208.size = 0xaaaaaaaaaaaaaaaa;
            local_208.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_208.ptr = (char *)0xaaaaaaaaaaaaaaaa;
            iVar9 = iVar9 + 1;
            QByteArray::QByteArray((QByteArray *)&local_2c8,1,(char)iVar9);
            local_2a8.size = local_2c8.size;
            local_2a8.ptr = local_2c8.ptr;
            local_2a8.d = local_2c8.d;
            text.d.d.ptr = (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
                            )&local_1e8;
            local_2c8.d = (Data *)0x0;
            local_2c8.ptr = (char *)0x0;
            local_2c8.size = 0;
            QByteArray::QByteArray((QByteArray *)&local_2e0,1,SUB161(auVar3 / ZEXT816(0xffef),0));
            QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>::
            QStringBuilder(&local_290,(QStringBuilder<const_QByteArray_&,_QByteArray> *)&text,
                           (QByteArray *)&local_2e0);
            QByteArray::mid((longlong)&local_2f8,(longlong)&local_1c8);
            QStringBuilder<QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>,_QByteArray>
            ::QStringBuilder(&local_258,&local_290,(QByteArray *)&local_2f8);
            QStringBuilder<QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>,_QByteArray>
            ::convertTo<QByteArray>((QByteArray *)&local_208,&local_258);
            QStringBuilder<QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>,_QByteArray>
            ::~QStringBuilder(&local_258);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_2f8);
            QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>::
            ~QStringBuilder(&local_290);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_2e0);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_2a8);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_2c8);
            pcVar20 = local_208.ptr;
            if (local_208.ptr == (char *)0x0) {
              pcVar20 = (char *)&QByteArray::_empty;
            }
            jpeg_write_marker(cinfo,0xe2,pcVar20,local_208.size & 0xffffffff);
            iVar10 = iVar10 + (int)lVar22;
            QArrayDataPointer<char>::~QArrayDataPointer(&local_208);
          }
          QArrayDataPointer<char>::~QArrayDataPointer(&local_1e8);
        }
        QArrayDataPointer<char>::~QArrayDataPointer(&local_1c8);
      }
      uVar11 = cinfo->image_width;
      __n_00 = (size_t)(int)uVar11;
      pJVar15 = (JSAMPROW)operator_new__((ulong)(cinfo->input_components * uVar11));
      *row_pointer = pJVar15;
      uVar21 = 0;
      if (0 < (int)uVar11) {
        uVar21 = uVar11;
      }
      uVar26 = (ulong)uVar21;
      while (cinfo->next_scanline < cinfo->image_height) {
        pJVar15 = *row_pointer;
        iVar6 = QImage::format();
        iVar8 = (int)image;
        switch(iVar6) {
        case 1:
        case 2:
          lVar22 = QImage::constScanLine(iVar8);
          iVar6 = QImage::format();
          if (bVar4 == 0) {
            if (iVar6 == 2) {
              for (uVar11 = 0; uVar21 != uVar11; uVar11 = uVar11 + 1) {
                uVar27 = (ulong)((*(byte *)(lVar22 + (ulong)(uVar11 >> 3)) >> (uVar11 & 7) & 1) != 0
                                );
                lVar17 = uVar27 * 4;
                *pJVar15 = *(JSAMPLE *)((long)local_318.ptr + lVar17 + 2);
                pJVar15[1] = *(JSAMPLE *)((long)local_318.ptr + lVar17 + 1);
                pJVar15[2] = (JSAMPLE)local_318.ptr[uVar27];
                pJVar15 = pJVar15 + 3;
              }
            }
            else {
              for (uVar11 = 0; uVar21 != uVar11; uVar11 = uVar11 + 1) {
                uVar27 = (ulong)((*(byte *)(lVar22 + (ulong)(uVar11 >> 3)) >> (~(byte)uVar11 & 7) &
                                 1) != 0);
                lVar17 = uVar27 * 4;
                *pJVar15 = *(JSAMPLE *)((long)local_318.ptr + lVar17 + 2);
                pJVar15[1] = *(JSAMPLE *)((long)local_318.ptr + lVar17 + 1);
                pJVar15[2] = (JSAMPLE)local_318.ptr[uVar27];
                pJVar15 = pJVar15 + 3;
              }
            }
          }
          else if (iVar6 == 2) {
            for (uVar27 = 0; uVar26 != uVar27; uVar27 = uVar27 + 1) {
              pJVar15[uVar27] =
                   *(JSAMPLE *)
                    ((long)local_318.ptr +
                    (ulong)((*(byte *)(lVar22 + (uVar27 >> 3 & 0x1fffffff)) >> ((uint)uVar27 & 7) &
                            1) != 0) * 4 + 2);
            }
          }
          else {
            for (uVar27 = 0; uVar26 != uVar27; uVar27 = uVar27 + 1) {
              pJVar15[uVar27] =
                   *(JSAMPLE *)
                    ((long)local_318.ptr +
                    (ulong)((*(byte *)(lVar22 + (uVar27 >> 3 & 0x1fffffff)) >> (~(byte)uVar27 & 7) &
                            1) != 0) * 4 + 2);
            }
          }
          break;
        case 3:
          lVar22 = QImage::constScanLine(iVar8);
          if (bVar4 == 0) {
            for (lVar17 = 0; uVar21 != (uint)lVar17; lVar17 = lVar17 + 1) {
              *pJVar15 = *(JSAMPLE *)
                          ((long)local_318.ptr + (ulong)*(byte *)(lVar22 + lVar17) * 4 + 2);
              pJVar15[1] = *(JSAMPLE *)
                            ((long)local_318.ptr + (ulong)*(byte *)(lVar22 + lVar17) * 4 + 1);
              pJVar15[2] = (JSAMPLE)local_318.ptr[*(byte *)(lVar22 + lVar17)];
              pJVar15 = pJVar15 + 3;
            }
          }
          else {
            for (lVar17 = 0; uVar21 != (uint)lVar17; lVar17 = lVar17 + 1) {
              pJVar15[lVar17] =
                   *(JSAMPLE *)((long)local_318.ptr + (ulong)*(byte *)(lVar22 + lVar17) * 4 + 2);
            }
          }
          break;
        case 4:
        case 5:
        case 6:
          lVar22 = QImage::constScanLine(iVar8);
          for (lVar17 = 0; uVar21 != (uint)lVar17; lVar17 = lVar17 + 1) {
            *pJVar15 = *(JSAMPLE *)(lVar22 + 2 + lVar17 * 4);
            pJVar15[1] = *(JSAMPLE *)(lVar22 + 1 + lVar17 * 4);
            pJVar15[2] = *(JSAMPLE *)(lVar22 + lVar17 * 4);
            pJVar15 = pJVar15 + 3;
          }
          break;
        case 7:
        case 8:
        case 9:
        case 10:
        case 0xb:
        case 0xc:
switchD_00107c52_caseD_7:
          local_258.a.a.b.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
          local_258.a.a.a = (QByteArray *)0xaaaaaaaaaaaaaaaa;
          local_258.a.a.b.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          QImage::copy((QImage *)&local_290,(EVP_PKEY_CTX *)image,(EVP_PKEY_CTX *)0x0);
          QImage::convertToFormat((QImage *)&local_258,(Format)&local_290,(ImageConversionFlags)0x4)
          ;
          QImage::~QImage((QImage *)&local_290);
          lVar22 = QImage::constScanLine((int)&local_258);
          for (lVar17 = 0; uVar21 != (uint)lVar17; lVar17 = lVar17 + 1) {
            *pJVar15 = *(JSAMPLE *)(lVar22 + 2 + lVar17 * 4);
            pJVar15[1] = *(JSAMPLE *)(lVar22 + 1 + lVar17 * 4);
            pJVar15[2] = *(JSAMPLE *)(lVar22 + lVar17 * 4);
            pJVar15 = pJVar15 + 3;
          }
          QImage::~QImage((QImage *)&local_258);
          break;
        case 0xd:
          pvVar16 = (void *)QImage::constScanLine(iVar8);
          __n = __n_00 * 3;
LAB_00108070:
          memcpy(pJVar15,pvVar16,__n);
          break;
        default:
          if (iVar6 == 0x18) {
            pvVar16 = (void *)QImage::constScanLine(iVar8);
            __n = __n_00;
            goto LAB_00108070;
          }
          if (iVar6 == 0x1c) {
            local_258.a.a.b.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
            local_258.a.a.a = (QByteArray *)0xaaaaaaaaaaaaaaaa;
            local_258.a.a.b.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            QImage::copy((QImage *)&local_290,(EVP_PKEY_CTX *)image,(EVP_PKEY_CTX *)0x0);
            QImage::convertToFormat
                      ((QImage *)&local_258,(Format)&local_290,(ImageConversionFlags)0x18);
            QImage::~QImage((QImage *)&local_290);
            pvVar16 = (void *)QImage::constScanLine((int)&local_258);
            memcpy(pJVar15,pvVar16,__n_00);
            QImage::~QImage((QImage *)&local_258);
          }
          else {
            if (iVar6 != 0x24) goto switchD_00107c52_caseD_7;
            pvVar16 = (void *)QImage::constScanLine(iVar8);
            __n = __n_00 * 4;
            if (!invertCMYK) goto LAB_00108070;
            for (uVar27 = 0; uVar26 != uVar27; uVar27 = uVar27 + 1) {
              *(uint *)(pJVar15 + uVar27 * 4) = ~*(uint *)((long)pvVar16 + uVar27 * 4);
            }
          }
        }
        jpeg_write_scanlines(cinfo,row_pointer,1);
      }
      jpeg_finish_compress(cinfo);
    }
    else {
      my_output_message((j_common_ptr)cinfo);
    }
    jpeg_destroy_compress(cinfo);
    operator_delete(pjVar12,0x1030);
  }
  QArrayDataPointer<unsigned_int>::~QArrayDataPointer(&local_318);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar25;
}

Assistant:

static bool do_write_jpeg_image(struct jpeg_compress_struct &cinfo,
                                JSAMPROW *row_pointer,
                                const QImage &image,
                                QIODevice *device,
                                int sourceQuality,
                                const QString &description,
                                bool optimize,
                                bool progressive,
                                bool invertCMYK)
{
    bool success = false;
    const QList<QRgb> cmap = image.colorTable();

    if (image.format() == QImage::Format_Invalid || image.format() == QImage::Format_Alpha8)
        return false;

    struct my_jpeg_destination_mgr *iod_dest = new my_jpeg_destination_mgr(device);
    struct my_error_mgr jerr;

    cinfo.err = jpeg_std_error(&jerr);
    jerr.error_exit = my_error_exit;
    jerr.output_message = my_output_message;

    if (!setjmp(jerr.setjmp_buffer)) {
        // WARNING:
        // this if loop is inside a setjmp/longjmp branch
        // do not create C++ temporaries here because the destructor may never be called
        // if you allocate memory, make sure that you can free it (row_pointer[0])
        jpeg_create_compress(&cinfo);

        cinfo.dest = iod_dest;

        cinfo.image_width = image.width();
        cinfo.image_height = image.height();

        bool gray = false;
        switch (image.format()) {
        case QImage::Format_Mono:
        case QImage::Format_MonoLSB:
        case QImage::Format_Indexed8:
            gray = true;
            for (int i = image.colorCount(); gray && i; i--) {
                gray = gray & qIsGray(cmap[i-1]);
            }
            cinfo.input_components = gray ? 1 : 3;
            cinfo.in_color_space = gray ? JCS_GRAYSCALE : JCS_RGB;
            break;
        case QImage::Format_Grayscale8:
        case QImage::Format_Grayscale16:
            gray = true;
            cinfo.input_components = 1;
            cinfo.in_color_space = JCS_GRAYSCALE;
            break;
        case QImage::Format_CMYK8888:
            cinfo.input_components = 4;
            cinfo.in_color_space = JCS_CMYK;
            break;
        default:
            cinfo.input_components = 3;
            cinfo.in_color_space = JCS_RGB;
        }

        jpeg_set_defaults(&cinfo);

        qreal diffInch = qAbs(image.dotsPerMeterX()*2.54/100. - qRound(image.dotsPerMeterX()*2.54/100.))
                         + qAbs(image.dotsPerMeterY()*2.54/100. - qRound(image.dotsPerMeterY()*2.54/100.));
        qreal diffCm = (qAbs(image.dotsPerMeterX()/100. - qRound(image.dotsPerMeterX()/100.))
                        + qAbs(image.dotsPerMeterY()/100. - qRound(image.dotsPerMeterY()/100.)))*2.54;
        if (diffInch < diffCm) {
            cinfo.density_unit = 1; // dots/inch
            cinfo.X_density = qRound(image.dotsPerMeterX()*2.54/100.);
            cinfo.Y_density = qRound(image.dotsPerMeterY()*2.54/100.);
        } else {
            cinfo.density_unit = 2; // dots/cm
            cinfo.X_density = (image.dotsPerMeterX()+50) / 100;
            cinfo.Y_density = (image.dotsPerMeterY()+50) / 100;
        }

        if (optimize)
            cinfo.optimize_coding = true;

        if (progressive)
            jpeg_simple_progression(&cinfo);

        int quality = sourceQuality >= 0 ? qMin(int(sourceQuality),100) : 75;
        jpeg_set_quality(&cinfo, quality, TRUE /* limit to baseline-JPEG values */);

        // If the quality exceeds a certain threshold (such as 90), disable chroma subsampling
        if (quality > 90) {
            cinfo.comp_info[0].v_samp_factor = 1;
            cinfo.comp_info[0].h_samp_factor = 1;
        }

        jpeg_start_compress(&cinfo, TRUE);

        set_text(image, &cinfo, description);
        if (cinfo.in_color_space == JCS_RGB || cinfo.in_color_space == JCS_CMYK)
            write_icc_profile(image, &cinfo);

        row_pointer[0] = new uchar[cinfo.image_width*cinfo.input_components];
        int w = cinfo.image_width;
        while (cinfo.next_scanline < cinfo.image_height) {
            uchar *row = row_pointer[0];
            switch (image.format()) {
            case QImage::Format_Mono:
            case QImage::Format_MonoLSB:
                if (gray) {
                    const uchar* data = image.constScanLine(cinfo.next_scanline);
                    if (image.format() == QImage::Format_MonoLSB) {
                        for (int i=0; i<w; i++) {
                            bool bit = !!(*(data + (i >> 3)) & (1 << (i & 7)));
                            row[i] = qRed(cmap[bit]);
                        }
                    } else {
                        for (int i=0; i<w; i++) {
                            bool bit = !!(*(data + (i >> 3)) & (1 << (7 -(i & 7))));
                            row[i] = qRed(cmap[bit]);
                        }
                    }
                } else {
                    const uchar* data = image.constScanLine(cinfo.next_scanline);
                    if (image.format() == QImage::Format_MonoLSB) {
                        for (int i=0; i<w; i++) {
                            bool bit = !!(*(data + (i >> 3)) & (1 << (i & 7)));
                            *row++ = qRed(cmap[bit]);
                            *row++ = qGreen(cmap[bit]);
                            *row++ = qBlue(cmap[bit]);
                        }
                    } else {
                        for (int i=0; i<w; i++) {
                            bool bit = !!(*(data + (i >> 3)) & (1 << (7 -(i & 7))));
                            *row++ = qRed(cmap[bit]);
                            *row++ = qGreen(cmap[bit]);
                            *row++ = qBlue(cmap[bit]);
                        }
                    }
                }
                break;
            case QImage::Format_Indexed8:
                if (gray) {
                    const uchar* pix = image.constScanLine(cinfo.next_scanline);
                    for (int i=0; i<w; i++) {
                        *row = qRed(cmap[*pix]);
                        ++row; ++pix;
                    }
                } else {
                    const uchar* pix = image.constScanLine(cinfo.next_scanline);
                    for (int i=0; i<w; i++) {
                        *row++ = qRed(cmap[*pix]);
                        *row++ = qGreen(cmap[*pix]);
                        *row++ = qBlue(cmap[*pix]);
                        ++pix;
                    }
                }
                break;
            case QImage::Format_Grayscale8:
                memcpy(row, image.constScanLine(cinfo.next_scanline), w);
                break;
            case QImage::Format_Grayscale16:
                {
                    QImage rowImg = image.copy(0, cinfo.next_scanline, w, 1).convertToFormat(QImage::Format_Grayscale8);
                    memcpy(row, rowImg.constScanLine(0), w);
                }
                break;
            case QImage::Format_RGB888:
                memcpy(row, image.constScanLine(cinfo.next_scanline), w * 3);
                break;
            case QImage::Format_RGB32:
            case QImage::Format_ARGB32:
            case QImage::Format_ARGB32_Premultiplied:
                {
                    const QRgb* rgb = (const QRgb*)image.constScanLine(cinfo.next_scanline);
                    for (int i=0; i<w; i++) {
                        *row++ = qRed(*rgb);
                        *row++ = qGreen(*rgb);
                        *row++ = qBlue(*rgb);
                        ++rgb;
                    }
                }
                break;
            case QImage::Format_CMYK8888: {
                auto *cmykIn = reinterpret_cast<const quint32 *>(image.constScanLine(cinfo.next_scanline));
                auto *cmykOut = reinterpret_cast<quint32 *>(row);
                if (invertCMYK) {
                    for (int i = 0; i < w; ++i)
                        cmykOut[i] = 0xffffffffu - cmykIn[i];
                } else {
                    memcpy(cmykOut, cmykIn, w * 4);
                }
                break;
            }
            default:
                {
                    // (Testing shows that this way is actually faster than converting to RGB888 + memcpy)
                    QImage rowImg = image.copy(0, cinfo.next_scanline, w, 1).convertToFormat(QImage::Format_RGB32);
                    const QRgb* rgb = (const QRgb*)rowImg.constScanLine(0);
                    for (int i=0; i<w; i++) {
                        *row++ = qRed(*rgb);
                        *row++ = qGreen(*rgb);
                        *row++ = qBlue(*rgb);
                        ++rgb;
                    }
                }
                break;
            }
            jpeg_write_scanlines(&cinfo, row_pointer, 1);
        }

        jpeg_finish_compress(&cinfo);
        jpeg_destroy_compress(&cinfo);
        success = true;
    } else {
        my_output_message(j_common_ptr(&cinfo));
        jpeg_destroy_compress(&cinfo);
        success = false;
    }

    delete iod_dest;
    return success;
}